

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O2

int testStateFeatureDescriptionInInputs(void)

{
  bool bVar1;
  ModelDescription *interface;
  FeatureDescription *feature;
  ostream *poVar2;
  ValidationPolicy validationPolicy;
  undefined1 local_70 [40];
  Model m;
  
  CoreML::Specification::Model::Model(&m);
  interface = CoreML::Specification::Model::_internal_mutable_description(&m);
  feature = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&interface->input_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"x",(allocator<char> *)&validationPolicy);
  setupStateFeature(feature,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  validationPolicy.allowsEmptyInput = true;
  validationPolicy.allowsEmptyOutput = true;
  validationPolicy.allowsMultipleFunctions = true;
  validationPolicy.allowsStatefulPrediction = true;
  CoreML::validateModelDescription((Result *)local_70,interface,9,&validationPolicy);
  bVar1 = CoreML::Result::good((Result *)local_70);
  std::__cxx11::string::~string((string *)(local_70 + 8));
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1a6);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,
                             "(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy)).good()"
                            );
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  CoreML::Specification::Model::~Model(&m);
  return (uint)!bVar1;
}

Assistant:

int testStateFeatureDescriptionInInputs() {
    Specification::Model m;
    auto *description = m.mutable_description();

    setupStateFeature(description->add_input(), "x");

    // Check model specification version requirements.
    auto validationPolicy = validationPolicyForStateTests();
    ML_ASSERT_GOOD(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy));

    return 0;
}